

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O2

double TestSpectra::DD_spectrum
                 (double xMin,double xMax,double expFall,double peakFrac,double peakMu,
                 double peakSig,double peakSkew)

{
  double dVar1;
  double dVar2;
  RandomGen *pRVar3;
  double xMin_00;
  double dVar4;
  double xMax_00;
  initializer_list<double> __l;
  allocator_type local_d1;
  double local_d0;
  double local_c8;
  undefined8 uStack_c0;
  vector<double,_std::allocator<double>_> xyTry;
  double local_48;
  undefined1 local_28 [16];
  pointer local_18;
  
  xMax_00 = 80.0;
  if (xMax <= 80.0) {
    xMax_00 = xMax;
  }
  xMin_00 = 0.0;
  if (0.0 <= xMin) {
    xMin_00 = xMin;
  }
  local_48 = (double)(~-(ulong)(peakMu < xMax_00) & 0x3ff0000000000000 |
                     (ulong)(peakFrac + 1.0) & -(ulong)(peakMu < xMax_00));
  local_d0 = peakMu;
  local_c8 = peakSig;
  pRVar3 = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(pRVar3);
  pRVar3 = RandomGen::rndm();
  dVar4 = RandomGen::rand_uniform(pRVar3);
  dVar4 = dVar4 * local_48 + 0.0;
  local_28._8_4_ = SUB84(dVar4,0);
  local_28._0_8_ = xMin_00 + dVar1 * (xMax_00 - xMin_00);
  local_28._12_4_ = (int)((ulong)dVar4 >> 0x20);
  local_18 = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_28;
  std::vector<double,_std::allocator<double>_>::vector(&xyTry,__l,&local_d1);
  while (0.0 < xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2]) {
    dVar1 = exp(-*xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start / expFall);
    dVar4 = (*xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start - local_d0) / local_c8;
    dVar4 = exp(-dVar4 * dVar4);
    dVar2 = erf(((*xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start - local_d0) * peakSkew) / local_c8);
    pRVar3 = RandomGen::rndm();
    RandomGen::VonNeumann
              ((vector<double,_std::allocator<double>_> *)local_28,pRVar3,xMin_00,xMax_00,0.0,
               local_48,*xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
               xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1],(dVar2 + 1.0) * dVar4 * peakFrac + dVar1);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&xyTry,(_Vector_base<double,_std::allocator<double>_> *)local_28);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_28);
  }
  uStack_c0 = 0;
  local_c8 = *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xyTry.super__Vector_base<double,_std::allocator<double>_>);
  return local_c8;
}

Assistant:

double TestSpectra::DD_spectrum(double xMin, double xMax, double expFall,
                                double peakFrac, double peakMu,
                                double peakSig, double peakSkew) {
  // JV LUX, most closely like JENDL-4. See arXiv:1608.05381. Lower than
  // G4/LUXSim
  if (xMax > 80.) xMax = 80.;
  if (xMin < 0.000) xMin = 0.000;
  double yMin = 0.0;
  double yMax = 1.; if ( peakMu < xMax ) yMax += peakFrac;
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = exp(-xyTry[0] / expFall) +
                       peakFrac * exp(-pow((xyTry[0] - peakMu) / peakSig, 2.))*(erf(peakSkew*(xyTry[0] - peakMu) / peakSig)+1);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, yMin, yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}